

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::HistogramTest_sample_count_Test::~HistogramTest_sample_count_Test
          (HistogramTest_sample_count_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HistogramTest, sample_count) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(200);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_count, 2U);
}